

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
exr_attr_list_add(exr_context_t ctxt,exr_attribute_list_t *list,char *name,exr_attribute_type_t type
                 ,int32_t data_len,uint8_t **data_ptr,exr_attribute_t **attr)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  char *in_RDX;
  size_t in_RSI;
  exr_attribute_t **in_RDI;
  undefined4 in_R8D;
  exr_attribute_list_t *in_R9;
  long *in_stack_00000008;
  int32_t in_stack_00000010;
  char *in_stack_00000018;
  exr_attribute_t *nattr;
  size_t slen;
  int32_t mlen;
  int32_t tidx;
  int32_t nlen;
  exr_result_t rval;
  _internal_exr_attr_map *known;
  exr_attribute_t **in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int32_t in_stack_ffffffffffffffa4;
  long lVar5;
  exr_attribute_list_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  exr_attribute_t *nattr_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar6;
  
  lVar5 = 0;
  if (in_RDI == (exr_attribute_t **)0x0) {
    eVar6 = 2;
  }
  else {
    eVar6 = validate_attr_arguments
                      ((exr_context_t)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0,(char *)0x0,in_stack_ffffffffffffffa4,
                       (uint8_t **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90);
    if (eVar6 == 0) {
      sVar3 = strlen(in_RDX);
      if ((ulong)(long)(int)(uint)*(byte *)((long)in_RDI + 2) < sVar3) {
        eVar6 = (*(code *)in_RDI[9])
                          (in_RDI,0xc,"Provided name \'%s\' too long for file (len %d, max %d)",
                           in_RDX,sVar3 & 0xffffffff,(uint)*(byte *)((long)in_RDI + 2));
      }
      else {
        uVar1 = (uint)sVar3;
        iVar2 = in_ECX + -1;
        if ((iVar2 < 0) || (the_predefined_attr_count <= iVar2)) {
          if (in_ECX == 0x1e) {
            eVar6 = (*(code *)in_RDI[9])
                              (in_RDI,3,
                               "Invalid type enum for \'%s\': the opaque type is not actually a built-in type"
                               ,in_RDX);
          }
          else {
            eVar6 = (*(code *)in_RDI[9])
                              (in_RDI,3,
                               "Invalid type enum for \'%s\' in create by builtin type (type %d)",
                               in_RDX,in_ECX);
          }
        }
        else {
          nattr_00 = (exr_attribute_t *)(the_predefined_attr_typenames + iVar2);
          uVar4 = 0;
          eVar6 = create_attr_block((exr_context_t)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    in_RDI,in_RSI,(int32_t)((ulong)in_RDX >> 0x20),
                                    (uint8_t **)CONCAT44(in_ECX,in_R8D),(char *)in_R9,
                                    in_stack_00000010,in_stack_00000018,(int32_t)nattr);
          if (eVar6 == 0) {
            *(char **)(lVar5 + 8) = nattr_00->name;
            *(char *)(lVar5 + 0x11) = (char)*(undefined4 *)&nattr_00->type_name;
            *(undefined4 *)(lVar5 + 0x14) = *(undefined4 *)((long)&nattr_00->type_name + 4);
            eVar6 = add_to_list((exr_context_t)CONCAT44(in_ECX,in_R8D),in_R9,nattr_00,
                                (char *)(ulong)uVar1);
          }
          if (eVar6 == 0) {
            *in_stack_00000008 = lVar5;
            check_attr_handler((exr_context_t)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               (exr_attribute_t *)CONCAT44(in_stack_ffffffffffffff9c,uVar4));
          }
          else if (in_R9 != (exr_attribute_list_t *)0x0) {
            in_R9->num_attributes = 0;
            in_R9->num_alloced = 0;
          }
        }
      }
    }
    else if (eVar6 < 0) {
      if (*(int *)(*in_stack_00000008 + 0x14) == in_ECX) {
        eVar6 = 0;
      }
      else {
        lVar5 = *in_stack_00000008;
        *in_stack_00000008 = 0;
        eVar6 = (*(code *)in_RDI[9])
                          (in_RDI,3,"Entry \'%s\' already in list but with different type (\'%s\')",
                           in_RDX,*(undefined8 *)(lVar5 + 8));
      }
    }
  }
  return eVar6;
}

Assistant:

exr_result_t
exr_attr_list_add (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    exr_attribute_type_t  type,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    const struct _internal_exr_attr_map* known = NULL;

    exr_result_t     rval = EXR_ERR_INVALID_ARGUMENT;
    int32_t          nlen, tidx, mlen;
    size_t           slen;
    exr_attribute_t* nattr = NULL;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    rval = validate_attr_arguments (ctxt, list, name, data_len, data_ptr, attr);
    if (rval != EXR_ERR_SUCCESS)
    {
        if (rval < 0)
        {
            if ((*attr)->type != type)
            {
                nattr = *attr;
                *attr = NULL;
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Entry '%s' already in list but with different type ('%s')",
                    name,
                    nattr->type_name);
            }
            return EXR_ERR_SUCCESS;
        }
        return rval;
    }

    slen = strlen (name);
    mlen = (int32_t) ctxt->max_name_length;
    if (slen > (size_t) mlen)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided name '%s' too long for file (len %d, max %d)",
            name,
            (int) slen,
            mlen);
    }
    nlen = (int32_t) slen;

    tidx = ((int) type) - 1;
    if (tidx < 0 || tidx >= the_predefined_attr_count)
    {
        if (type == EXR_ATTR_OPAQUE)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid type enum for '%s': the opaque type is not actually a built-in type",
                name);

        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid type enum for '%s' in create by builtin type (type %d)",
            name,
            (int) type);
    }

    known = &(the_predefined_attr_typenames[tidx]);

    rval = create_attr_block (
        ctxt, &nattr, known->exp_size, data_len, data_ptr, name, nlen, NULL, 0);

    if (rval == EXR_ERR_SUCCESS)
    {
        nattr->type_name        = known->name;
        nattr->type_name_length = (uint8_t) known->name_len;
        nattr->type             = known->type;
        rval                    = add_to_list (ctxt, list, nattr, name);
    }

    if (rval == EXR_ERR_SUCCESS)
    {
        *attr = nattr;
        check_attr_handler (ctxt, nattr);
    }
    else if (data_ptr)
        *data_ptr = NULL;
    return rval;
}